

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O2

int Abc_NtkReduceNodes(Abc_Ntk_t *pNtk,Vec_Ptr_t *vNodes)

{
  void *pvVar1;
  Abc_Obj_t *pObj;
  int iVar2;
  int iVar3;
  
  if (pNtk->ntkType == ABC_NTK_LOGIC) {
    for (iVar2 = 0; iVar2 < vNodes->nSize; iVar2 = iVar2 + 1) {
      pvVar1 = Vec_PtrEntry(vNodes,iVar2);
      *(byte *)((long)pvVar1 + 0x14) = *(byte *)((long)pvVar1 + 0x14) | 0x10;
    }
    iVar2 = 0;
    for (iVar3 = 0; iVar3 < pNtk->vObjs->nSize; iVar3 = iVar3 + 1) {
      pObj = Abc_NtkObj(pNtk,iVar3);
      if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0x1f) == 7)) {
        Abc_NtkDeleteObj(pObj);
        iVar2 = iVar2 + 1;
      }
    }
    for (iVar3 = 0; iVar3 < vNodes->nSize; iVar3 = iVar3 + 1) {
      pvVar1 = Vec_PtrEntry(vNodes,iVar3);
      *(byte *)((long)pvVar1 + 0x14) = *(byte *)((long)pvVar1 + 0x14) & 0xef;
    }
    iVar3 = Abc_NtkCheck(pNtk);
    if (iVar3 == 0) {
      puts("Abc_NtkCleanup: The network check has failed.");
    }
    return iVar2;
  }
  __assert_fail("Abc_NtkIsLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                ,0x21d,"int Abc_NtkReduceNodes(Abc_Ntk_t *, Vec_Ptr_t *)");
}

Assistant:

int Abc_NtkReduceNodes( Abc_Ntk_t * pNtk, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pNode;
    int i, Counter;
    assert( Abc_NtkIsLogic(pNtk) );
    // mark the nodes reachable from the POs
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        pNode->fMarkA = 1;
    // remove the non-marked nodes
    Counter = 0;
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( pNode->fMarkA == 0 )
        {
            Abc_NtkDeleteObj( pNode );
            Counter++;
        }
    // unmark the remaining nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        pNode->fMarkA = 0;
    // check
    if ( !Abc_NtkCheck( pNtk ) )
        printf( "Abc_NtkCleanup: The network check has failed.\n" );
    return Counter;
}